

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

string * __thiscall
lest::to_string<(anonymous_namespace)::State,(anonymous_namespace)::State>
          (string *__return_storage_ptr__,lest *this,State *lhs,string *op,State *rhs)

{
  uint *puVar1;
  ostream *poVar2;
  ostringstream os;
  long *local_350;
  long local_348;
  long local_340 [2];
  long *local_330;
  long local_328;
  long local_320 [2];
  long local_310 [3];
  uint auStack_2f8 [22];
  ios_base local_2a0 [264];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_310);
  puVar1 = (uint *)((long)auStack_2f8 + *(long *)(local_310[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::ostream::operator<<((ostream *)local_310,*(int *)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_310);
  std::ios_base::~ios_base(local_2a0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(char *)local_330,local_328);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,*(char **)lhs,*(undefined8 *)(lhs + 2));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_310);
  puVar1 = (uint *)((long)auStack_2f8 + *(long *)(local_310[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::ostream::operator<<((ostream *)local_310,*(int *)&(op->_M_dataplus)._M_p);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_310);
  std::ios_base::~ios_base(local_2a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_350,local_348);
  if (local_350 != local_340) {
    operator_delete(local_350,local_340[0] + 1);
  }
  if (local_330 != local_320) {
    operator_delete(local_330,local_320[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}